

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O3

void __thiscall QOpenGLWindow::metric(QOpenGLWindow *this)

{
  PaintDeviceMetric in_ESI;
  
  metric((QOpenGLWindow *)&this[-1].field_0x10,in_ESI);
  return;
}

Assistant:

int QOpenGLWindow::metric(PaintDeviceMetric metric) const
{
    Q_D(const QOpenGLWindow);

    switch (metric) {
        case PdmDepth:
            if (d->paintDevice)
                return d->paintDevice->depth();
            break;
        default:
            break;
    }
    return QPaintDeviceWindow::metric(metric);
}